

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  unsigned_short *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  string<unsigned_short> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  puVar1 = this->P;
  uVar2 = 2;
  do {
    uVar4 = uVar2;
    this->P = (unsigned_short *)((long)puVar1 + uVar4);
    uVar2 = uVar4 + 2;
  } while (*(short *)((long)puVar1 + uVar4) != 0x3e);
  while( true ) {
    uVar4 = uVar4 - 2;
    iVar3 = isspace((uint)*(ushort *)((long)puVar1 + uVar4));
    if (iVar3 == 0) break;
    this->P = (unsigned_short *)((long)puVar1 + uVar4);
  }
  core::string<unsigned_short>::string<unsigned_short>(&local_30,puVar1 + 1,(s32)(uVar4 >> 1));
  core::string<unsigned_short>::operator=(&this->NodeName,&local_30);
  core::string<unsigned_short>::~string(&local_30);
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}